

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O2

int preg_of(dill_stream c,basic_block_conflict bb,int vreg)

{
  arg_info_list paVar1;
  
  if (vreg < 100) {
    paVar1 = c->p->c_param_args;
    if (paVar1[vreg].is_register != '\0') {
      return paVar1[vreg].in_reg;
    }
    return -1;
  }
  if (bb->reg_assigns[vreg - 100U] != -1) {
    return (int)bb->reg_assigns[vreg - 100U];
  }
  return c->p->vregs[vreg - 100U].preg;
}

Assistant:

static int
preg_of(dill_stream c, basic_block bb, int vreg)
{
    if (vreg >= 100) {
        if (bb->reg_assigns[vreg - 100] == -1) {
            return c->p->vregs[vreg - 100].preg;
        } else {
            return bb->reg_assigns[vreg - 100];
        }
    } else {
        /* parameter */;
        if (c->p->c_param_args[vreg].is_register) {
            return c->p->c_param_args[vreg].in_reg;
        }
        return -1;
    }
}